

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

void __thiscall
Fossilize::StateRecorder::init_recording_synchronized(StateRecorder *this,DatabaseInterface *iface)

{
  Impl *pIVar1;
  bool bVar2;
  anon_struct_40_5_2613688a_for_record_data local_38;
  
  pIVar1 = this->impl;
  pIVar1->database_iface = iface;
  local_38.write_database_entries = true;
  local_38.payload_flags = 0;
  local_38.need_flush = false;
  local_38.need_prepare = true;
  local_38.blob.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.blob.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.blob.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Impl::anon_struct_40_5_2613688a_for_record_data::operator=(&pIVar1->record_data,&local_38);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_38.blob.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  pIVar1 = this->impl;
  if (pIVar1->module_identifier_database_iface == (DatabaseInterface *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = pIVar1->on_use_database_iface != (DatabaseInterface *)0x0;
  }
  pIVar1->should_record_identifier_only = bVar2;
  return;
}

Assistant:

void StateRecorder::init_recording_synchronized(DatabaseInterface *iface)
{
	impl->database_iface = iface;
	impl->record_data = {};
	impl->should_record_identifier_only =
			impl->module_identifier_database_iface && impl->on_use_database_iface;
}